

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

boolean find_offensive(monst *mtmp,musable *m)

{
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  bool bVar5;
  obj *helmet;
  boolean reflection_skip;
  obj *poStack_28;
  boolean ranged_stuff;
  obj *obj;
  musable *m_local;
  monst *mtmp_local;
  
  bVar1 = lined_up(mtmp);
  if (((u.uprops[0x2a].extrinsic != 0) || (youmonst.data == mons + 0x9d)) ||
     (bVar5 = false, youmonst.data == mons + 0x94)) {
    iVar3 = rn2(2);
    bVar5 = iVar3 != 0;
  }
  poVar4 = which_armor(mtmp,4);
  m->offensive = (obj *)0x0;
  m->has_offense = MUSE_NONE;
  if ((((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) && ((mtmp->data->mflags1 & 0x40000) == 0)) &&
     (((mtmp->data->mflags1 & 0x10000) == 0 && ((mtmp->data->mflags1 & 0x2000) == 0)))) {
    if ((u._1052_1_ & 1) == 0) {
      bVar2 = in_your_sanctuary(mtmp,'\0','\0');
      if (bVar2 == '\0') {
        bVar2 = dmgtype(mtmp->data,0x1b);
        if (((bVar2 == '\0') || (uwep != (obj *)0x0)) ||
           ((uarmu != (obj *)0x0 ||
            (((((uarm != (obj *)0x0 || (uarmh != (obj *)0x0)) || (uarms != (obj *)0x0)) ||
              ((uarmg != (obj *)0x0 || (uarmc != (obj *)0x0)))) || (uarmf != (obj *)0x0)))))) {
          if (bVar1 == '\0') {
            mtmp_local._7_1_ = false;
          }
          else {
            for (poStack_28 = mtmp->minvent; poStack_28 != (obj *)0x0; poStack_28 = poStack_28->nobj
                ) {
              if (bVar5) {
LAB_002665e9:
                if (m->has_offense != MUSE_WAN_STRIKING) {
                  if ((poStack_28->otyp == 0x1c4) && ('\0' < poStack_28->spe)) {
                    m->offensive = poStack_28;
                    m->has_offense = MUSE_WAN_STRIKING;
                  }
                  if (m->has_offense != MUSE_WAN_CANCELLATION) {
                    if ((poStack_28->otyp == 0x1ca) && ('\0' < poStack_28->spe)) {
                      m->offensive = poStack_28;
                      m->has_offense = MUSE_WAN_CANCELLATION;
                    }
                    if (m->has_offense != MUSE_POT_PARALYSIS) {
                      if ((poStack_28->otyp == 0x12e) && (-1 < multi)) {
                        m->offensive = poStack_28;
                        m->has_offense = MUSE_POT_PARALYSIS;
                      }
                      if (m->has_offense != MUSE_POT_BLINDNESS) {
                        if ((poStack_28->otyp == 0x133) &&
                           (bVar1 = attacktype(mtmp->data,0xf), bVar1 == '\0')) {
                          m->offensive = poStack_28;
                          m->has_offense = MUSE_POT_BLINDNESS;
                        }
                        if (m->has_offense != MUSE_POT_CONFUSION) {
                          if (poStack_28->otyp == 0x12d) {
                            m->offensive = poStack_28;
                            m->has_offense = MUSE_POT_CONFUSION;
                          }
                          if (m->has_offense != MUSE_POT_SLEEPING) {
                            if (poStack_28->otyp == 0x13d) {
                              m->offensive = poStack_28;
                              m->has_offense = MUSE_POT_SLEEPING;
                            }
                            if (m->has_offense != MUSE_POT_ACID) {
                              if (poStack_28->otyp == 0x141) {
                                m->offensive = poStack_28;
                                m->has_offense = MUSE_POT_ACID;
                              }
                              if (((m->has_offense != MUSE_SCR_EARTH) && (poStack_28->otyp == 0x163)
                                  ) && ((((poVar4 != (obj *)0x0 &&
                                          ((10 < (*(ushort *)&objects[poVar4->otyp].field_0x11 >> 4
                                                 & 0x1f) &&
                                           ((*(ushort *)&objects[poVar4->otyp].field_0x11 >> 4 &
                                            0x1f) < 0x12)))) ||
                                         (((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0 ||
                                          (((((mtmp->data->mflags1 & 4) != 0 ||
                                             ((mtmp->data->mflags1 & 8) != 0)) ||
                                            (mtmp->data->mlet == '6')) ||
                                           (((mtmp->data->mflags1 & 0x100000) != 0 ||
                                            (iVar3 = rn2(10), iVar3 == 0)))))))) &&
                                        ((((iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux
                                                          ,(int)mtmp->muy), iVar3 < 3 &&
                                           (((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0 &&
                                            ((mtmp->data->mflags1 & 0x1000) == 0)))) &&
                                          (bVar1 = on_level(&u.uz,&dungeon_topology.d_rogue_level),
                                          bVar1 == '\0')) &&
                                         ((u.uz.dnum != dungeon_topology.d_astral_level.dnum ||
                                          (bVar1 = on_level(&u.uz,&dungeon_topology.d_earth_level),
                                          bVar1 != '\0')))))))) {
                                m->offensive = poStack_28;
                                m->has_offense = MUSE_SCR_EARTH;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                if ((poStack_28->otyp == 0x1d4) && ('\0' < poStack_28->spe)) {
                  m->offensive = poStack_28;
                  m->has_offense = MUSE_WAN_DEATH;
                }
                if (m->has_offense != MUSE_WAN_SLEEP) {
                  if (((poStack_28->otyp == 0x1d3) && ('\0' < poStack_28->spe)) && (-1 < multi)) {
                    m->offensive = poStack_28;
                    m->has_offense = MUSE_WAN_SLEEP;
                  }
                  if (m->has_offense != MUSE_WAN_FIRE) {
                    if ((poStack_28->otyp == 0x1d1) && ('\0' < poStack_28->spe)) {
                      m->offensive = poStack_28;
                      m->has_offense = MUSE_WAN_FIRE;
                    }
                    if (m->has_offense != MUSE_FIRE_HORN) {
                      if ((poStack_28->otyp == 0x100) && ('\0' < poStack_28->spe)) {
                        m->offensive = poStack_28;
                        m->has_offense = MUSE_FIRE_HORN;
                      }
                      if (m->has_offense != MUSE_WAN_COLD) {
                        if ((poStack_28->otyp == 0x1d2) && ('\0' < poStack_28->spe)) {
                          m->offensive = poStack_28;
                          m->has_offense = MUSE_WAN_COLD;
                        }
                        if (m->has_offense != MUSE_FROST_HORN) {
                          if ((poStack_28->otyp == 0xff) && ('\0' < poStack_28->spe)) {
                            m->offensive = poStack_28;
                            m->has_offense = MUSE_FROST_HORN;
                          }
                          if (m->has_offense != MUSE_WAN_LIGHTNING) {
                            if ((poStack_28->otyp == 0x1d5) && ('\0' < poStack_28->spe)) {
                              m->offensive = poStack_28;
                              m->has_offense = MUSE_WAN_LIGHTNING;
                            }
                            if (m->has_offense != MUSE_WAN_MAGIC_MISSILE) {
                              if ((poStack_28->otyp == 0x1d0) && ('\0' < poStack_28->spe)) {
                                m->offensive = poStack_28;
                                m->has_offense = MUSE_WAN_MAGIC_MISSILE;
                              }
                              goto LAB_002665e9;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            mtmp_local._7_1_ = m->has_offense != MUSE_NONE;
          }
        }
        else {
          mtmp_local._7_1_ = false;
        }
      }
      else {
        mtmp_local._7_1_ = false;
      }
    }
    else {
      mtmp_local._7_1_ = false;
    }
  }
  else {
    mtmp_local._7_1_ = false;
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean find_offensive(struct monst *mtmp, struct musable *m)
{
	struct obj *obj;
	boolean ranged_stuff = lined_up(mtmp);
	boolean reflection_skip = (Reflecting && rn2(2));
	struct obj *helmet = which_armor(mtmp, W_ARMH);

	m->offensive = NULL;
	m->has_offense = 0;
	if (mtmp->mpeaceful || is_animal(mtmp->data) ||
				mindless(mtmp->data) || nohands(mtmp->data))
		return FALSE;
	if (u.uswallow) return FALSE;
	if (in_your_sanctuary(mtmp, 0, 0)) return FALSE;
	if (dmgtype(mtmp->data, AD_HEAL) && !uwep && !uarmu
	    && !uarm && !uarmh && !uarms && !uarmg && !uarmc && !uarmf)
		return FALSE;

	if (!ranged_stuff) return FALSE;
#define nomore(x) if (m->has_offense==x) continue;
	for (obj=mtmp->minvent; obj; obj=obj->nobj) {
		/* nomore(MUSE_WAN_DEATH); */
		if (!reflection_skip) {
		    if (obj->otyp == WAN_DEATH && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_DEATH;
		    }
		    nomore(MUSE_WAN_SLEEP);
		    if (obj->otyp == WAN_SLEEP && obj->spe > 0 && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_SLEEP;
		    }
		    nomore(MUSE_WAN_FIRE);
		    if (obj->otyp == WAN_FIRE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_FIRE;
		    }
		    nomore(MUSE_FIRE_HORN);
		    if (obj->otyp == FIRE_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FIRE_HORN;
		    }
		    nomore(MUSE_WAN_COLD);
		    if (obj->otyp == WAN_COLD && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_COLD;
		    }
		    nomore(MUSE_FROST_HORN);
		    if (obj->otyp == FROST_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FROST_HORN;
		    }
		    nomore(MUSE_WAN_LIGHTNING);
		    if (obj->otyp == WAN_LIGHTNING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_LIGHTNING;
		    }
		    nomore(MUSE_WAN_MAGIC_MISSILE);
		    if (obj->otyp == WAN_MAGIC_MISSILE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_MAGIC_MISSILE;
		    }
		}
		nomore(MUSE_WAN_STRIKING);
		if (obj->otyp == WAN_STRIKING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_STRIKING;
		}
		nomore(MUSE_WAN_CANCELLATION);
		if (obj->otyp == WAN_CANCELLATION && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_CANCELLATION;
		}
		nomore(MUSE_POT_PARALYSIS);
		if (obj->otyp == POT_PARALYSIS && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_PARALYSIS;
		}
		nomore(MUSE_POT_BLINDNESS);
		if (obj->otyp == POT_BLINDNESS && !attacktype(mtmp->data, AT_GAZE)) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_BLINDNESS;
		}
		nomore(MUSE_POT_CONFUSION);
		if (obj->otyp == POT_CONFUSION) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_CONFUSION;
		}
		nomore(MUSE_POT_SLEEPING);
		if (obj->otyp == POT_SLEEPING) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_SLEEPING;
		}
		nomore(MUSE_POT_ACID);
		if (obj->otyp == POT_ACID) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_ACID;
		}
		/* we can safely put this scroll here since the locations that
		 * are in a 1 square radius are a subset of the locations that
		 * are in wand range
		 */
		nomore(MUSE_SCR_EARTH);
		if (obj->otyp == SCR_EARTH
		       && ((helmet && is_metallic(helmet)) ||
				mtmp->mconf || amorphous(mtmp->data) ||
				passes_walls(mtmp->data) ||
				noncorporeal(mtmp->data) ||
				unsolid(mtmp->data) || !rn2(10))
		       && dist2(mtmp->mx,mtmp->my,mtmp->mux,mtmp->muy) <= 2
		       && mtmp->mcansee && haseyes(mtmp->data)
		       && !Is_rogue_level(&u.uz)
		       && (!In_endgame(&u.uz) || Is_earthlevel(&u.uz))) {
		    m->offensive = obj;
		    m->has_offense = MUSE_SCR_EARTH;
		}
	}
	return (boolean)(!!m->has_offense);
#undef nomore
}